

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O3

VarnodeTpl * __thiscall OperandSymbol::getVarnode(OperandSymbol *this)

{
  TripleSymbol *pTVar1;
  int iVar2;
  VarnodeTpl *pVVar3;
  long *plVar4;
  
  if (this->defexp != (PatternExpression *)0x0) {
    pVVar3 = (VarnodeTpl *)operator_new(0x68);
    VarnodeTpl::VarnodeTpl(pVVar3,this->hand,true);
    return pVVar3;
  }
  pTVar1 = this->triple;
  if (pTVar1 != (TripleSymbol *)0x0) {
    plVar4 = (long *)__dynamic_cast(pTVar1,&TripleSymbol::typeinfo,&SpecificSymbol::typeinfo,0);
    if (plVar4 != (long *)0x0) {
      pVVar3 = (VarnodeTpl *)(**(code **)(*plVar4 + 0x60))(plVar4);
      return pVVar3;
    }
    iVar2 = (*(pTVar1->super_SleighSymbol)._vptr_SleighSymbol[2])(pTVar1);
    if ((iVar2 == 4) ||
       (iVar2 = (*(this->triple->super_SleighSymbol)._vptr_SleighSymbol[2])(), iVar2 == 5)) {
      pVVar3 = (VarnodeTpl *)operator_new(0x68);
      VarnodeTpl::VarnodeTpl(pVVar3,this->hand,true);
      return pVVar3;
    }
  }
  pVVar3 = (VarnodeTpl *)operator_new(0x68);
  VarnodeTpl::VarnodeTpl(pVVar3,this->hand,false);
  return pVVar3;
}

Assistant:

VarnodeTpl *OperandSymbol::getVarnode(void) const

{
  VarnodeTpl *res;
  if (defexp != (PatternExpression *)0)
    res = new VarnodeTpl(hand,true); // Definite constant handle
  else {
    SpecificSymbol *specsym = dynamic_cast<SpecificSymbol *>(triple);
    if (specsym != (SpecificSymbol *)0)
      res = specsym->getVarnode();
    else if ((triple != (TripleSymbol *)0)&&
	     ((triple->getType() == valuemap_symbol)||(triple->getType() == name_symbol)))
      res = new VarnodeTpl(hand,true); // Zero-size symbols
    else
      res = new VarnodeTpl(hand,false); // Possible dynamic handle
  }
  return res;
}